

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# circular_view_algorithm_suite.cpp
# Opt level: O2

void copy_suite::partition_copy(void)

{
  bool bVar1;
  byte *pbVar2;
  reference __value;
  back_insert_iterator<vista::circular_view<int,_18446744073709551615UL>_> *this;
  initializer_list<int> input;
  initializer_list<int> __l;
  initializer_list<int> __l_00;
  iterator iVar3;
  vector<int,_std::allocator<int>_> expect;
  back_insert_iterator<vista::circular_view<int,_18446744073709551615UL>_> local_108;
  iterator local_100;
  iterator local_f0;
  iterator local_e0;
  back_insert_iterator<vista::circular_view<int,_18446744073709551615UL>_> local_d0;
  int no_copy_array [4];
  circular_view<int,_18446744073709551615UL> yes_copy;
  int yes_copy_array [4];
  int array [4];
  circular_view<int,_18446744073709551615UL> no_copy;
  circular_view<int,_18446744073709551615UL> span;
  
  span.member.data = array;
  array[0] = 0;
  array[1] = 0;
  array[2] = 0;
  array[3] = 0;
  span.member.cap = 4;
  span.member.size = 0;
  span.member.next = 4;
  yes_copy.member.data = (pointer)0x160000000b;
  yes_copy.member.cap = 0x2c00000021;
  yes_copy.member.size = CONCAT44(yes_copy.member.size._4_4_,0x37);
  input._M_len = 5;
  input._M_array = (iterator)&yes_copy;
  vista::circular_view<int,_18446744073709551615UL>::assign(&span,input);
  yes_copy.member.data = yes_copy_array;
  yes_copy.member.cap = 4;
  yes_copy.member.size = 0;
  yes_copy.member.next = 4;
  no_copy.member.data = no_copy_array;
  no_copy.member.cap = 4;
  no_copy.member.size = 0;
  no_copy.member.next = 4;
  iVar3 = vista::circular_view<int,_18446744073709551615UL>::begin(&span);
  local_e0 = vista::circular_view<int,_18446744073709551615UL>::end(&span);
  expect.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._0_16_ =
       iVar3;
  local_108.container = &yes_copy;
  local_d0.container = &no_copy;
  while( true ) {
    bVar1 = vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator!=
                      ((basic_iterator<int> *)&expect,&local_e0);
    if (!bVar1) break;
    pbVar2 = (byte *)vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::
                     operator*((basic_iterator<int> *)&expect);
    this = &local_d0;
    if ((*pbVar2 & 1) == 0) {
      this = &local_108;
    }
    __value = vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator*
                        ((basic_iterator<int> *)&expect);
    std::back_insert_iterator<vista::circular_view<int,_18446744073709551615UL>_>::operator=
              (this,__value);
    vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator++
              ((basic_iterator<int> *)&expect);
  }
  local_e0.parent = (view_pointer)0x2c00000016;
  __l._M_len = 2;
  __l._M_array = (iterator)&local_e0;
  std::vector<int,_std::allocator<int>_>::vector(&expect,__l,(allocator_type *)&local_108);
  iVar3 = vista::circular_view<int,_18446744073709551615UL>::begin(&yes_copy);
  local_f0 = vista::circular_view<int,_18446744073709551615UL>::end(&yes_copy);
  boost::detail::
  test_all_eq_impl<std::ostream,vista::circular_view<int,18446744073709551615ul>::basic_iterator<int>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_algorithm_suite.cpp"
             ,0x88,"void copy_suite::partition_copy()",iVar3,local_f0,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
             expect.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start,(__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                      expect.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&expect.super__Vector_base<int,_std::allocator<int>_>);
  local_e0.parent = (view_pointer)0x3700000021;
  __l_00._M_len = 2;
  __l_00._M_array = (iterator)&local_e0;
  std::vector<int,_std::allocator<int>_>::vector(&expect,__l_00,(allocator_type *)&local_108);
  iVar3 = vista::circular_view<int,_18446744073709551615UL>::begin(&no_copy);
  local_100 = vista::circular_view<int,_18446744073709551615UL>::end(&no_copy);
  boost::detail::
  test_all_eq_impl<std::ostream,vista::circular_view<int,18446744073709551615ul>::basic_iterator<int>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_algorithm_suite.cpp"
             ,0x8d,"void copy_suite::partition_copy()",iVar3,local_100,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
             expect.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start,(__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                      expect.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&expect.super__Vector_base<int,_std::allocator<int>_>);
  return;
}

Assistant:

void partition_copy()
{
    int array[4] = {};
    circular_view<int> span(array);
    span = { 11, 22, 33, 44, 55 };
    int yes_copy_array[4];
    circular_view<int> yes_copy(yes_copy_array);
    int no_copy_array[4];
    circular_view<int> no_copy(no_copy_array);
    std::partition_copy(span.begin(), span.end(), std::back_inserter(yes_copy), std::back_inserter(no_copy), [](int value) { return value % 2 == 0; });
    {
        std::vector<int> expect = { 22, 44 };
        BOOST_TEST_ALL_EQ(yes_copy.begin(), yes_copy.end(),
                          expect.begin(), expect.end());
    }
    {
        std::vector<int> expect = { 33, 55 };
        BOOST_TEST_ALL_EQ(no_copy.begin(), no_copy.end(),
                          expect.begin(), expect.end());
    }
}